

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffs2tm(char *datestr,int *year,int *month,int *day,int *hour,int *minute,double *second,
          int *status)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ushort **ppuVar4;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  uint *in_R8;
  uint *in_R9;
  double dVar5;
  char errmsg [81];
  int slen;
  char acStack_98 [16];
  int *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int local_4;
  
  if (*(int *)errmsg._16_8_ < 1) {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = 0;
    }
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = 0;
    }
    if (in_R8 != (uint *)0x0) {
      *in_R8 = 0;
    }
    if (in_R9 != (uint *)0x0) {
      *in_R9 = 0;
    }
    if (errmsg._8_8_ != 0) {
      *(undefined8 *)errmsg._8_8_ = 0;
    }
    if (in_RDI == (char *)0x0) {
      ffpmsg((char *)0x241994);
      *(undefined4 *)errmsg._16_8_ = 0x1a4;
      local_4 = 0x1a4;
    }
    else {
      if ((in_RDI[2] == '/') || (in_RDI[4] == '-')) {
        iVar1 = ffs2dt(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        if (0 < iVar1) {
          return *(int *)errmsg._16_8_;
        }
        sVar3 = strlen(in_RDI);
        iVar1 = (int)sVar3;
        if ((iVar1 == 8) || (iVar1 == 10)) {
          return *(int *)errmsg._16_8_;
        }
        if (iVar1 < 0x13) {
          ffpmsg((char *)0x241a62);
          ffpmsg((char *)0x241a6f);
          *(undefined4 *)errmsg._16_8_ = 0x1a4;
          return 0x1a4;
        }
        if (in_RDI[10] == 'T') {
          if ((in_RDI[0xd] != ':') || (in_RDI[0x10] != ':')) {
            ffpmsg((char *)0x241cc4);
            ffpmsg((char *)0x241cd1);
            *(undefined4 *)errmsg._16_8_ = 0x1a4;
            return 0x1a4;
          }
          ppuVar4 = __ctype_b_loc();
          if (((((((*ppuVar4)[(int)in_RDI[0xb]] & 0x800) == 0) ||
                (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[0xc]] & 0x800) == 0)) ||
               (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[0xe]] & 0x800) == 0)) ||
              ((ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[0xf]] & 0x800) == 0 ||
               (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[0x11]] & 0x800) == 0)))) ||
             (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[0x12]] & 0x800) == 0)) {
            ffpmsg((char *)0x241c8b);
            ffpmsg((char *)0x241c98);
            *(undefined4 *)errmsg._16_8_ = 0x1a4;
            return 0x1a4;
          }
          if ((0x13 < iVar1) && (in_RDI[0x13] != '.')) {
            ffpmsg((char *)0x241be6);
            ffpmsg((char *)0x241bf3);
            *(undefined4 *)errmsg._16_8_ = 0x1a4;
            return 0x1a4;
          }
          if (in_R8 != (uint *)0x0) {
            uVar2 = atoi(in_RDI + 0xb);
            *in_R8 = uVar2;
          }
          if (in_R9 != (uint *)0x0) {
            uVar2 = atoi(in_RDI + 0xe);
            *in_R9 = uVar2;
          }
          if (errmsg._8_8_ != 0) {
            dVar5 = atof(in_RDI + 0x11);
            *(double *)errmsg._8_8_ = dVar5;
          }
        }
      }
      else {
        if ((in_RDI[2] != ':') || (in_RDI[5] != ':')) {
          ffpmsg((char *)0x241ec4);
          ffpmsg((char *)0x241ed1);
          *(undefined4 *)errmsg._16_8_ = 0x1a4;
          return 0x1a4;
        }
        ppuVar4 = __ctype_b_loc();
        if ((((((*ppuVar4)[(int)*in_RDI] & 0x800) == 0) ||
             (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[1]] & 0x800) == 0)) ||
            (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[3]] & 0x800) == 0)) ||
           (((ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[4]] & 0x800) == 0 ||
             (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[6]] & 0x800) == 0)) ||
            (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)in_RDI[7]] & 0x800) == 0)))) {
          ffpmsg((char *)0x241e8b);
          ffpmsg((char *)0x241e98);
          *(undefined4 *)errmsg._16_8_ = 0x1a4;
          return 0x1a4;
        }
        if (in_R8 != (uint *)0x0) {
          uVar2 = atoi(in_RDI);
          *in_R8 = uVar2;
        }
        if (in_R9 != (uint *)0x0) {
          uVar2 = atoi(in_RDI + 3);
          *in_R9 = uVar2;
        }
        if (errmsg._8_8_ != 0) {
          dVar5 = atof(in_RDI + 6);
          *(double *)errmsg._8_8_ = dVar5;
        }
      }
      if ((in_R8 == (uint *)0x0) || ((-1 < (int)*in_R8 && ((int)*in_R8 < 0x18)))) {
        if ((in_R9 == (uint *)0x0) || ((-1 < (int)*in_R9 && ((int)*in_R9 < 0x3c)))) {
          if ((errmsg._8_8_ == 0) ||
             ((0.0 < *(double *)errmsg._8_8_ || *(double *)errmsg._8_8_ == 0.0 &&
              (*(double *)errmsg._8_8_ < 61.0)))) {
            local_4 = *(int *)errmsg._16_8_;
          }
          else {
            snprintf(acStack_98,0x51,"second value is out of range 0 - 60.9999: %f (ffs2tm)",
                     *(undefined8 *)errmsg._8_8_);
            ffpmsg((char *)0x242013);
            *(undefined4 *)errmsg._16_8_ = 0x1a4;
            local_4 = 0x1a4;
          }
        }
        else {
          snprintf(acStack_98,0x51,"minute value is out of range 0 - 59: %d (ffs2tm)",(ulong)*in_R9)
          ;
          ffpmsg((char *)0x241f93);
          *(undefined4 *)errmsg._16_8_ = 0x1a4;
          local_4 = 0x1a4;
        }
      }
      else {
        snprintf(acStack_98,0x51,"hour value is out of range 0 - 23: %d (ffs2tm)",(ulong)*in_R8);
        ffpmsg((char *)0x241f32);
        *(undefined4 *)errmsg._16_8_ = 0x1a4;
        local_4 = 0x1a4;
      }
    }
  }
  else {
    local_4 = *(int *)errmsg._16_8_;
  }
  return local_4;
}

Assistant:

int ffs2tm(char *datestr,     /* I - date string: "YYYY-MM-DD"    */
                              /*     or "YYYY-MM-DDThh:mm:ss.ddd" */
                              /*     or "dd/mm/yy"                */
           int *year,         /* O - year (0 - 9999)              */
           int *month,        /* O - month (1 - 12)               */
           int *day,          /* O - day (1 - 31)                 */
           int *hour,          /* I - hour (0 - 23)                */
           int *minute,        /* I - minute (0 - 59)              */
           double *second,     /* I - second (0. - 60.9999999)     */
           int   *status)     /* IO - error status                */
/*
  Parse a date character string into date and time values
*/
{
    int slen;
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (year)
       *year   = 0;
    if (month)
       *month  = 0;
    if (day)
       *day    = 0;
    if (hour)
       *hour   = 0;
    if (minute)
       *minute = 0;
    if (second)
       *second = 0.;

    if (!datestr)
    {
        ffpmsg("error: null input date string (ffs2tm)");
        return(*status = BAD_DATE);   /* Null datestr pointer ??? */
    }

    if (datestr[2] == '/' || datestr[4] == '-')
    {
        /*  Parse the year, month, and date */
        if (ffs2dt(datestr, year, month, day, status) > 0)
            return(*status);

        slen = strlen(datestr);
        if (slen == 8 || slen == 10)
            return(*status);               /* OK, no time fields */
        else if (slen < 19) 
        {
            ffpmsg("input date string has illegal format:");
            ffpmsg(datestr);
            return(*status = BAD_DATE);
        }

        else if (datestr[10] == 'T')
        {
          if (datestr[13] == ':' && datestr[16] == ':') {
            if (isdigit((int) datestr[11]) && isdigit((int) datestr[12])
             && isdigit((int) datestr[14]) && isdigit((int) datestr[15])
             && isdigit((int) datestr[17]) && isdigit((int) datestr[18]) )
             {
                if (slen > 19 && datestr[19] != '.')
                {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
                }

                /* this is a new format string: "yyyy-mm-ddThh:mm:ss.dddd" */
                if (hour)
                    *hour   = atoi(&datestr[11]);

                if (minute)
                    *minute = atoi(&datestr[14]);

                if (second)
                    *second = atof(&datestr[17]);
             }
             else
             {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
             }

          }
          else
          {
               ffpmsg("input date string has illegal format:");
               ffpmsg(datestr);
               return(*status = BAD_DATE);
          }
        }
    }
    else   /* no date fields */
    {
        if (datestr[2] == ':' && datestr[5] == ':')   /* time string */
        {
            if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
             && isdigit((int) datestr[3]) && isdigit((int) datestr[4])
             && isdigit((int) datestr[6]) && isdigit((int) datestr[7]) )
            {
                 /* this is a time string: "hh:mm:ss.dddd" */
                 if (hour)
                    *hour   = atoi(&datestr[0]);

                 if (minute)
                    *minute = atoi(&datestr[3]);

                if (second)
                    *second = atof(&datestr[6]);
            }
            else
            {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
            }

        }
        else
        {
                  ffpmsg("input date string has illegal format:");
                  ffpmsg(datestr);
                  return(*status = BAD_DATE);
        }

    }

    if (hour)
       if (*hour < 0 || *hour > 23)
       {
          snprintf(errmsg,FLEN_ERRMSG, 
          "hour value is out of range 0 - 23: %d (ffs2tm)", *hour);
          ffpmsg(errmsg);
          return(*status = BAD_DATE);
       }

    if (minute)
       if (*minute < 0 || *minute > 59)
       {
          snprintf(errmsg, FLEN_ERRMSG,
          "minute value is out of range 0 - 59: %d (ffs2tm)", *minute);
          ffpmsg(errmsg);
          return(*status = BAD_DATE);
       }

    if (second)
       if (*second < 0 || *second >= 61.)
       {
          snprintf(errmsg, FLEN_ERRMSG,
          "second value is out of range 0 - 60.9999: %f (ffs2tm)", *second);
          ffpmsg(errmsg);
          return(*status = BAD_DATE);
       }

    return(*status);
}